

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceQueueFamilyProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  unsigned_long uVar1;
  TestContext *this;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  MessageBuilder *pMVar2;
  size_type sVar3;
  const_reference value;
  allocator<char> local_379;
  string local_378;
  MessageBuilder local_358;
  unsigned_long local_1d8;
  size_t queueNdx;
  MessageBuilder local_1b8;
  undefined1 local_38 [8];
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  queueProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tcu::TestContext::getLog(this);
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_38,vk,physicalDevice);
  tcu::TestLog::operator<<
            (&local_1b8,
             (TestLog *)
             queueProperties.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [10])"device = ");
  queueNdx = (size_t)Context::getPhysicalDevice(context);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(VkPhysicalDevice_s **)&queueNdx);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  local_1d8 = 0;
  while( true ) {
    uVar1 = local_1d8;
    sVar3 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
            size((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  *)local_38);
    if (sVar3 <= uVar1) break;
    tcu::TestLog::operator<<
              (&local_358,
               (TestLog *)
               queueProperties.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_358,&local_1d8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x13c7be4);
    value = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
            operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        *)local_38,local_1d8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,value);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    local_1d8 = local_1d8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Querying queue properties succeeded",&local_379);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties (Context& context)
{
	TestLog&								log					= context.getTestContext().getLog();
	const vector<VkQueueFamilyProperties>	queueProperties		= getPhysicalDeviceQueueFamilyProperties(context.getInstanceInterface(), context.getPhysicalDevice());

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage;

	for (size_t queueNdx = 0; queueNdx < queueProperties.size(); queueNdx++)
		log << TestLog::Message << queueNdx << ": " << queueProperties[queueNdx] << TestLog::EndMessage;

	return tcu::TestStatus::pass("Querying queue properties succeeded");
}